

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEigenAnalysis.cpp
# Opt level: O1

void __thiscall
TPZEigenAnalysis::TPZEigenAnalysis
          (TPZEigenAnalysis *this,TPZCompMesh *mesh,bool mustOptimizeBandwidth,ostream *out)

{
  complex<double> *__s;
  
  TPZAnalysis::TPZAnalysis
            (&this->super_TPZAnalysis,&PTR_PTR_019920f0,mesh,mustOptimizeBandwidth,out);
  (this->super_TPZAnalysis).super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZEigenAnalysis_01991fe8;
  (this->fEigenvalues).super_TPZVec<std::complex<double>_>.fStore = (complex<double> *)0x0;
  (this->fEigenvalues).super_TPZVec<std::complex<double>_>.fNElements = 0;
  (this->fEigenvalues).super_TPZVec<std::complex<double>_>.fNAlloc = 0;
  (this->fEigenvalues).super_TPZVec<std::complex<double>_>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01840c18;
  __s = (this->fEigenvalues).fExtAlloc;
  memset(__s,0,0xa0);
  (this->fEigenvalues).super_TPZVec<std::complex<double>_>.fStore = __s;
  (this->fEigenvalues).super_TPZVec<std::complex<double>_>.fNElements = 0;
  (this->fEigenvalues).super_TPZVec<std::complex<double>_>.fNAlloc = 0;
  (this->fEigenvectors).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = 0;
  (this->fEigenvectors).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = 0;
  (this->fEigenvectors).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed =
       '\0';
  (this->fEigenvectors).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive =
       '\0';
  (this->fEigenvectors).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01841760;
  (this->fEigenvectors).fElem = (complex<double> *)0x0;
  (this->fEigenvectors).fGiven = (complex<double> *)0x0;
  (this->fEigenvectors).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fEigenvectors).fPivot.super_TPZVec<int>,0);
  (this->fEigenvectors).fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0183cde8;
  (this->fEigenvectors).fPivot.super_TPZVec<int>.fStore = (this->fEigenvectors).fPivot.fExtAlloc;
  (this->fEigenvectors).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fEigenvectors).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fEigenvectors).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01840c80;
  (this->fEigenvectors).fWork.fStore = (complex<double> *)0x0;
  (this->fEigenvectors).fWork.fNElements = 0;
  (this->fEigenvectors).fWork.fNAlloc = 0;
  this->fCalcVectors = true;
  return;
}

Assistant:

TPZEigenAnalysis::TPZEigenAnalysis(TPZCompMesh *mesh,
                                   bool mustOptimizeBandwidth, std::ostream &out)
  : TPZAnalysis(mesh, mustOptimizeBandwidth,out)
{

}